

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3Fts3EvalPhrasePoslist(Fts3Cursor *pCsr,Fts3Expr *pExpr,int iCol,char **ppOut)

{
  byte *pbVar1;
  u8 uVar2;
  Fts3Phrase *pFVar3;
  sqlite3_vtab *psVar4;
  Fts3Phrase *pFVar5;
  char *pBuf;
  bool bVar6;
  bool bVar7;
  uint uVar8;
  char *pEnd;
  Fts3Expr *pFVar9;
  byte *pbVar10;
  u8 uVar11;
  byte bVar12;
  byte bVar13;
  byte bVar14;
  ulong uVar15;
  undefined1 *puVar16;
  int iVar17;
  int iVar18;
  char *pEnd_1;
  byte *pbVar19;
  long in_FS_OFFSET;
  int rc;
  u8 local_5d;
  int local_5c;
  undefined1 *local_58;
  int local_4c;
  byte *local_48;
  undefined1 *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pFVar3 = pExpr->pPhrase;
  psVar4 = (pCsr->base).pVtab;
  *ppOut = (char *)0x0;
  if ((pFVar3->iColumn != iCol) && (iVar17 = 0, pFVar3->iColumn < *(int *)&psVar4[2].pModule))
  goto LAB_001d5ed4;
  local_4c = -0x55555556;
  local_58 = (undefined1 *)pExpr->iDocid;
  pbVar19 = (byte *)(pFVar3->doclist).pList;
  if ((local_58 != (undefined1 *)pCsr->iPrevId) || (pExpr->bEof != '\0')) {
    local_5c = 0;
    pFVar9 = pExpr->pParent;
    local_48 = pbVar19;
    if (pFVar9 != (Fts3Expr *)0x0) {
      bVar14 = *(byte *)((long)&psVar4[0x13].pModule + 7);
      bVar6 = false;
      bVar7 = false;
      do {
        if (pFVar9->eType == 4) {
          bVar7 = true;
        }
        if (pFVar9->eType == 1) {
          pExpr = pFVar9;
        }
        if (pFVar9->bEof != '\0') {
          bVar6 = true;
        }
        pFVar9 = pFVar9->pParent;
      } while (pFVar9 != (Fts3Expr *)0x0);
      if (bVar7) {
        uVar2 = pExpr->bDeferred;
        pFVar9 = pExpr;
        while (uVar2 != '\0') {
          pFVar9 = pFVar9->pParent;
          uVar2 = pFVar9->bDeferred;
        }
        if (pFVar3->bIncr != 0) {
          uVar2 = pFVar9->bEof;
          fts3EvalRestart(pCsr,pFVar9,&local_5c);
          do {
            iVar17 = local_5c;
            if (local_5c != 0) goto LAB_001d5ed4;
            uVar11 = pFVar9->bEof;
            if (uVar11 != '\0') goto LAB_001d5f05;
            fts3EvalNextRow(pCsr,pFVar9,&local_5c);
          } while ((uVar2 != '\0') || ((undefined1 *)pFVar9->iDocid != local_58));
          iVar17 = local_5c;
          if (local_5c != 0) goto LAB_001d5ed4;
          uVar11 = pFVar9->bEof;
LAB_001d5f05:
          iVar17 = 0x10b;
          if (uVar11 != uVar2) goto LAB_001d5ed4;
        }
        if (bVar6) {
          do {
            if (pFVar9->bEof != '\0') goto LAB_001d5f37;
            fts3EvalNextRow(pCsr,pFVar9,&local_5c);
            iVar17 = local_5c;
          } while (local_5c == 0);
          goto LAB_001d5ed4;
        }
LAB_001d5f37:
        if (pExpr != (Fts3Expr *)0x0) {
          pbVar19 = (byte *)0x0;
          bVar7 = false;
LAB_001d5f4a:
          pFVar9 = pExpr;
          if (pExpr->eType == 1) {
            pFVar9 = pExpr->pRight;
          }
          pFVar5 = pFVar9->pPhrase;
          local_48 = (byte *)pFVar5->pOrPoslist;
          local_58 = (undefined1 *)pFVar5->iOrDocid;
          iVar17 = (pFVar5->doclist).nAll;
          if (pCsr->bDesc != bVar14) {
            if (iVar17 == 0) {
              local_5d = '\x01';
            }
            else if (local_48 == (byte *)0x0) {
              local_5d = '\0';
            }
            else {
              local_5d = local_48 <= (pFVar5->doclist).aAll;
            }
            do {
              if (local_48 == (byte *)0x0) {
                if (local_5d != '\0') goto LAB_001d6125;
              }
              else {
                puVar16 = (undefined1 *)pCsr->iPrevId;
                bVar6 = (long)local_58 < (long)puVar16;
                if (bVar14 == 0) {
                  bVar6 = (long)puVar16 < (long)local_58;
                }
                if ((!bVar6) || (local_5d != '\0')) goto LAB_001d6104;
              }
              sqlite3Fts3DoclistPrev
                        ((uint)bVar14,(pFVar5->doclist).aAll,(pFVar5->doclist).nAll,
                         (char **)&local_48,(sqlite3_int64 *)&local_58,(int *)&local_40,&local_5d);
            } while( true );
          }
          if (iVar17 == 0) {
            local_5d = '\x01';
          }
          else {
            local_5d = (pFVar5->doclist).aAll + iVar17 <= local_48;
          }
LAB_001d5fa9:
          if (local_48 != (byte *)0x0) {
            puVar16 = (undefined1 *)pCsr->iPrevId;
            iVar17 = -(uint)(local_58 != puVar16);
            if ((long)puVar16 < (long)local_58) {
              iVar17 = 1;
            }
            iVar18 = -iVar17;
            if (bVar14 == 0) {
              iVar18 = iVar17;
            }
            if ((-1 < iVar18) || (local_5d != '\0')) goto LAB_001d6104;
            pbVar10 = local_48;
            bVar12 = *local_48;
            if (*local_48 != 0) {
              do {
                pbVar1 = pbVar10 + 1;
                pbVar10 = pbVar10 + 1;
                bVar13 = bVar12 & 0x80;
                bVar12 = *pbVar1;
              } while (bVar13 != 0 || *pbVar1 != 0);
            }
            do {
              pbVar1 = pbVar10 + 1;
              if ((pFVar5->doclist).aAll + (pFVar5->doclist).nAll <= pbVar1) {
                local_5d = '\x01';
                local_48 = pbVar10 + 1;
                goto LAB_001d5fa9;
              }
              pbVar10 = pbVar1;
            } while (*pbVar1 == 0);
            local_40 = &DAT_aaaaaaaaaaaaaaaa;
            iVar17 = sqlite3Fts3GetVarintU((char *)pbVar1,(sqlite_uint64 *)&local_40);
            local_48 = pbVar1 + iVar17;
            puVar16 = (undefined1 *)-(long)local_40;
            if (bVar14 == 0) {
              puVar16 = local_40;
            }
            local_58 = local_58 + (long)puVar16;
            goto LAB_001d5fa9;
          }
          if (local_5d == '\0') {
            pBuf = (pFVar5->doclist).aAll;
            iVar17 = sqlite3Fts3GetVarintU(pBuf,(sqlite_uint64 *)&local_58);
            local_48 = (byte *)(pBuf + iVar17);
            goto LAB_001d5fa9;
          }
LAB_001d6125:
          pFVar5->pOrPoslist = (char *)0x0;
          pFVar5->iOrDocid = (i64)local_58;
          goto LAB_001d6136;
        }
        goto LAB_001d6153;
      }
    }
    iVar17 = 0;
    goto LAB_001d5ed4;
  }
LAB_001d6164:
  iVar17 = 0;
  local_48 = pbVar19;
  if (pbVar19 != (byte *)0x0) {
    if (*pbVar19 == 1) {
      pbVar10 = pbVar19 + 1;
      if ((char)pbVar19[1] < '\0') {
        local_48 = pbVar10;
        uVar8 = sqlite3Fts3GetVarint32((char *)pbVar10,&local_4c);
        uVar15 = (ulong)uVar8;
      }
      else {
        uVar15 = 1;
        local_4c = (int)(char)pbVar19[1];
      }
      local_48 = pbVar10 + uVar15;
    }
    else {
      local_4c = 0;
    }
    if (local_4c < iCol) {
      do {
        bVar14 = *local_48;
        pbVar19 = local_48;
        if (1 < bVar14) {
          do {
            bVar12 = bVar14 & 0x80;
            bVar14 = pbVar19[1];
            pbVar19 = pbVar19 + 1;
          } while ((bVar14 & 0xfe) != 0 || bVar12 != 0);
        }
        if (bVar14 == 0) goto LAB_001d5ed4;
        pbVar10 = pbVar19 + 1;
        if ((char)pbVar19[1] < '\0') {
          local_48 = pbVar10;
          uVar8 = sqlite3Fts3GetVarint32((char *)pbVar10,&local_4c);
          uVar15 = (ulong)uVar8;
        }
        else {
          uVar15 = 1;
          local_4c = (int)(char)pbVar19[1];
        }
        local_48 = pbVar10 + uVar15;
      } while (local_4c < iCol);
    }
    pbVar19 = local_48;
    if (*local_48 == 0) {
      pbVar19 = (byte *)0x0;
    }
    if (local_4c != iCol) {
      pbVar19 = (byte *)0x0;
    }
    *ppOut = (char *)pbVar19;
    iVar17 = 0;
  }
LAB_001d5ed4:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return iVar17;
  }
  __stack_chk_fail();
LAB_001d6104:
  pFVar5->pOrPoslist = (char *)local_48;
  pFVar5->iOrDocid = (i64)local_58;
  if ((local_5d != '\0') || (local_58 != puVar16)) {
LAB_001d6136:
    pExpr = pExpr->pLeft;
    bVar7 = true;
    if (pExpr == (Fts3Expr *)0x0) goto LAB_001d6164;
    goto LAB_001d5f4a;
  }
  pExpr = pExpr->pLeft;
  if (pExpr == (Fts3Expr *)0x0) goto LAB_001d6147;
  goto LAB_001d5f4a;
LAB_001d6147:
  if (bVar7) {
    pbVar19 = (byte *)0x0;
  }
  else {
LAB_001d6153:
    pbVar19 = (byte *)pFVar3->pOrPoslist;
  }
  goto LAB_001d6164;
}

Assistant:

SQLITE_PRIVATE int sqlite3Fts3EvalPhrasePoslist(
  Fts3Cursor *pCsr,               /* FTS3 cursor object */
  Fts3Expr *pExpr,                /* Phrase to return doclist for */
  int iCol,                       /* Column to return position list for */
  char **ppOut                    /* OUT: Pointer to position list */
){
  Fts3Phrase *pPhrase = pExpr->pPhrase;
  Fts3Table *pTab = (Fts3Table *)pCsr->base.pVtab;
  char *pIter;
  int iThis;
  sqlite3_int64 iDocid;

  /* If this phrase is applies specifically to some column other than
  ** column iCol, return a NULL pointer.  */
  *ppOut = 0;
  assert( iCol>=0 && iCol<pTab->nColumn );
  if( (pPhrase->iColumn<pTab->nColumn && pPhrase->iColumn!=iCol) ){
    return SQLITE_OK;
  }

  iDocid = pExpr->iDocid;
  pIter = pPhrase->doclist.pList;
  if( iDocid!=pCsr->iPrevId || pExpr->bEof ){
    int rc = SQLITE_OK;
    int bDescDoclist = pTab->bDescIdx;      /* For DOCID_CMP macro */
    int bOr = 0;
    u8 bTreeEof = 0;
    Fts3Expr *p;                  /* Used to iterate from pExpr to root */
    Fts3Expr *pNear;              /* Most senior NEAR ancestor (or pExpr) */
    Fts3Expr *pRun;               /* Closest non-deferred ancestor of pNear */
    int bMatch;

    /* Check if this phrase descends from an OR expression node. If not,
    ** return NULL. Otherwise, the entry that corresponds to docid
    ** pCsr->iPrevId may lie earlier in the doclist buffer. Or, if the
    ** tree that the node is part of has been marked as EOF, but the node
    ** itself is not EOF, then it may point to an earlier entry. */
    pNear = pExpr;
    for(p=pExpr->pParent; p; p=p->pParent){
      if( p->eType==FTSQUERY_OR ) bOr = 1;
      if( p->eType==FTSQUERY_NEAR ) pNear = p;
      if( p->bEof ) bTreeEof = 1;
    }
    if( bOr==0 ) return SQLITE_OK;
    pRun = pNear;
    while( pRun->bDeferred ){
      assert( pRun->pParent );
      pRun = pRun->pParent;
    }

    /* This is the descendent of an OR node. In this case we cannot use
    ** an incremental phrase. Load the entire doclist for the phrase
    ** into memory in this case.  */
    if( pPhrase->bIncr ){
      int bEofSave = pRun->bEof;
      fts3EvalRestart(pCsr, pRun, &rc);
      while( rc==SQLITE_OK && !pRun->bEof ){
        fts3EvalNextRow(pCsr, pRun, &rc);
        if( bEofSave==0 && pRun->iDocid==iDocid ) break;
      }
      assert( rc!=SQLITE_OK || pPhrase->bIncr==0 );
      if( rc==SQLITE_OK && pRun->bEof!=bEofSave ){
        rc = FTS_CORRUPT_VTAB;
      }
    }
    if( bTreeEof ){
      while( rc==SQLITE_OK && !pRun->bEof ){
        fts3EvalNextRow(pCsr, pRun, &rc);
      }
    }
    if( rc!=SQLITE_OK ) return rc;

    bMatch = 1;
    for(p=pNear; p; p=p->pLeft){
      u8 bEof = 0;
      Fts3Expr *pTest = p;
      Fts3Phrase *pPh;
      assert( pTest->eType==FTSQUERY_NEAR || pTest->eType==FTSQUERY_PHRASE );
      if( pTest->eType==FTSQUERY_NEAR ) pTest = pTest->pRight;
      assert( pTest->eType==FTSQUERY_PHRASE );
      pPh = pTest->pPhrase;

      pIter = pPh->pOrPoslist;
      iDocid = pPh->iOrDocid;
      if( pCsr->bDesc==bDescDoclist ){
        bEof = !pPh->doclist.nAll ||
          (pIter >= (pPh->doclist.aAll + pPh->doclist.nAll));
        while( (pIter==0 || DOCID_CMP(iDocid, pCsr->iPrevId)<0 ) && bEof==0 ){
          sqlite3Fts3DoclistNext(
              bDescDoclist, pPh->doclist.aAll, pPh->doclist.nAll,
              &pIter, &iDocid, &bEof
          );
        }
      }else{
        bEof = !pPh->doclist.nAll || (pIter && pIter<=pPh->doclist.aAll);
        while( (pIter==0 || DOCID_CMP(iDocid, pCsr->iPrevId)>0 ) && bEof==0 ){
          int dummy;
          sqlite3Fts3DoclistPrev(
              bDescDoclist, pPh->doclist.aAll, pPh->doclist.nAll,
              &pIter, &iDocid, &dummy, &bEof
              );
        }
      }
      pPh->pOrPoslist = pIter;
      pPh->iOrDocid = iDocid;
      if( bEof || iDocid!=pCsr->iPrevId ) bMatch = 0;
    }

    if( bMatch ){
      pIter = pPhrase->pOrPoslist;
    }else{
      pIter = 0;
    }
  }
  if( pIter==0 ) return SQLITE_OK;

  if( *pIter==0x01 ){
    pIter++;
    pIter += fts3GetVarint32(pIter, &iThis);
  }else{
    iThis = 0;
  }
  while( iThis<iCol ){
    fts3ColumnlistCopy(0, &pIter);
    if( *pIter==0x00 ) return SQLITE_OK;
    pIter++;
    pIter += fts3GetVarint32(pIter, &iThis);
  }
  if( *pIter==0x00 ){
    pIter = 0;
  }

  *ppOut = ((iCol==iThis)?pIter:0);
  return SQLITE_OK;
}